

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O3

void testMultiPartThreading(string *tempDir)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the multi part APIs for multi-thread use",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  cVar1 = IlmThread_3_2::supportsThreads();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Threading not supported!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    plVar3 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  else {
    random_reseed(1);
    IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::numThreads();
    iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
    anon_unknown.dwarf_224fb3::testWriteRead(1,1,5,tempDir);
    anon_unknown.dwarf_224fb3::testWriteRead(2,2,10,tempDir);
    anon_unknown.dwarf_224fb3::testWriteRead(5,5,0x19,tempDir);
    anon_unknown.dwarf_224fb3::testWriteRead(0x32,2,0xfa,tempDir);
    iVar2 = IlmThread_3_2::ThreadPool::globalThreadPool();
    IlmThread_3_2::ThreadPool::setNumThreads(iVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  return;
}

Assistant:

void
testMultiPartThreading (const std::string& tempDir)
{
    try
    {
        cout << "Testing the multi part APIs for multi-thread use" << endl;

        if (!ILMTHREAD_NAMESPACE::supportsThreads ())
        {
            cout << "   Threading not supported!" << endl << endl;
            return;
        }
#if ILMTHREAD_THREADING_ENABLED
        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (32);

        testWriteRead (1, 1, 5, tempDir);
        testWriteRead (2, 2, 10, tempDir);
        testWriteRead (5, 5, 25, tempDir);
        testWriteRead (50, 2, 250, tempDir);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);
#endif
        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}